

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O3

int checkbox_box_width_proc(Am_Object *self)

{
  Am_Value *in_value;
  Am_Widget_Look look;
  Am_Widget_Look local_c;
  
  in_value = Am_Object::Get(self,0x17f,0);
  local_c.value = Am_MOTIF_LOOK_val;
  if ((in_value->type != 1) && (in_value->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&local_c,in_value);
  }
  local_c.value = SUB84(in_value->value,0);
  if (local_c.value < (Am_MACINTOSH_LOOK_val|Am_WINDOWS_LOOK_val)) {
    return *(int *)(&DAT_0028d22c +
                   (ulong)(local_c.value & (Am_MACINTOSH_LOOK_val|Am_WINDOWS_LOOK_val)) * 4);
  }
  Am_Error("Unknown Look parameter");
}

Assistant:

Am_Define_Formula(int, checkbox_box_width)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int width = 0;

  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    width = 15;
    break;

  case Am_WINDOWS_LOOK_val:
    width = 13;
    break;

  case Am_MACINTOSH_LOOK_val:
    width = 12;
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  return width;
}